

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blenders_generic.h
# Opt level: O2

void __thiscall
agge::blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
operator()(blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
           *this,pixel *pixels,int param_2,int param_3,count_t n,cover_type *covers)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  
  for (lVar2 = 0; n != (count_t)lVar2; lVar2 = lVar2 + 1) {
    iVar3 = (uint)covers[lVar2] * this->_a;
    bVar1 = (this->_color).r;
    if (iVar3 == 0x3fffc0) {
      pixels[lVar2].components[0] = bVar1;
      pixels[lVar2].components[1] = (this->_color).g;
      pixels[lVar2].components[2] = (this->_color).b;
    }
    else {
      pixels[lVar2].components[0] =
           (char)(((uint)bVar1 - (uint)pixels[lVar2].components[0]) * iVar3 >> 0x16) +
           pixels[lVar2].components[0];
      pixels[lVar2].components[1] =
           (char)(((uint)(this->_color).g - (uint)pixels[lVar2].components[1]) * iVar3 >> 0x16) +
           pixels[lVar2].components[1];
      pixels[lVar2].components[2] =
           (char)(((uint)(this->_color).b - (uint)pixels[lVar2].components[2]) * iVar3 >> 0x16) +
           pixels[lVar2].components[2];
    }
  }
  return;
}

Assistant:

inline void blender_solid_color_rgb<PixelT, OrderT>::operator ()(pixel *pixels, int /*x*/, int /*y*/, count_t n,
		const cover_type *covers) const
	{
		for (; n; --n, ++pixels)
		{
			const int alpha = _a * *covers++;

			if (0x3FFFC0 ^ alpha)
			{
				pixels->components[OrderT::R]
					+= static_cast<uint8_t>((_color.r - pixels->components[OrderT::R]) * alpha >> 22);
				pixels->components[OrderT::G]
					+= static_cast<uint8_t>((_color.g - pixels->components[OrderT::G]) * alpha >> 22);
				pixels->components[OrderT::B]
					+= static_cast<uint8_t>((_color.b - pixels->components[OrderT::B]) * alpha >> 22);
			}
			else
			{
				pixels->components[OrderT::R] = _color.r;
				pixels->components[OrderT::G] = _color.g;
				pixels->components[OrderT::B] = _color.b;
			}
		}
	}